

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PackageSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PackageSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&,slang::ast::VariableLifetime>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          NetType *args_3,VariableLifetime *args_4)

{
  string_view name;
  PackageSymbol *pPVar1;
  SourceLocation in_RCX;
  size_t in_RDX;
  char *in_RSI;
  PackageSymbol *in_R8;
  Compilation *in_R9;
  VariableLifetime unaff_retaddr;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  
  pPVar1 = (PackageSymbol *)
           allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  name._M_str = in_RSI;
  name._M_len = in_RDX;
  ast::PackageSymbol::PackageSymbol(in_R8,in_R9,name,in_RCX,*(NetType **)(in_RDX + 8),unaff_retaddr)
  ;
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }